

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

void __thiscall capnp::_::RpcSystemBase::Impl::~Impl(Impl *this)

{
  Type local_18;
  Impl *local_10;
  Impl *this_local;
  
  local_18.this = this;
  local_10 = this;
  kj::UnwindDetector::
  catchExceptionsIfUnwinding<capnp::_::RpcSystemBase::Impl::~Impl()::_lambda()_1_>
            (&this->unwindDetector,&local_18);
  std::
  unordered_map<capnp::_::VatNetworkBase::Connection_*,_kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState>,_std::hash<capnp::_::VatNetworkBase::Connection_*>,_std::equal_to<capnp::_::VatNetworkBase::Connection_*>,_std::allocator<std::pair<capnp::_::VatNetworkBase::Connection_*const,_kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState>_>_>_>
  ::~unordered_map(&this->connections);
  kj::TaskSet::~TaskSet(&this->tasks);
  kj::
  Maybe<capnp::RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::Client>
  ::~Maybe(&this->gateway);
  kj::Maybe<capnp::Capability::Client>::~Maybe(&this->bootstrapInterface);
  return;
}

Assistant:

~Impl() noexcept(false) {
    unwindDetector.catchExceptionsIfUnwinding([&]() {
      // std::unordered_map doesn't like it when elements' destructors throw, so carefully
      // disassemble it.
      if (!connections.empty()) {
        kj::Vector<kj::Own<RpcConnectionState>> deleteMe(connections.size());
        kj::Exception shutdownException = KJ_EXCEPTION(FAILED, "RpcSystem was destroyed.");
        for (auto& entry: connections) {
          entry.second->disconnect(kj::cp(shutdownException));
          deleteMe.add(kj::mv(entry.second));
        }
      }
    });
  }